

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld)

{
  sColMap *psVar1;
  u8 uVar2;
  char cVar3;
  u8 uVar4;
  sqlite3 *db;
  undefined1 uVar5;
  int iVar6;
  FKey *pFKey;
  sColMap *psVar7;
  Expr *pEVar8;
  Expr *pEVar9;
  Expr *pRight;
  char *pcVar10;
  ExprList *pEList;
  SrcList *pSrc;
  Trigger *p;
  Schema *pSVar11;
  Select *pSVar12;
  uint uVar13;
  long lVar14;
  sqlite3 *pParse_00;
  Token tOld;
  int *aiCol;
  Token tNew;
  Index *pIdx;
  Token tToCol;
  Token tFromCol;
  Expr *local_e8;
  Select *local_c8;
  ExprList *local_c0;
  Expr *local_b8;
  Token local_a8;
  char *local_98;
  int *local_90;
  Token local_88;
  TriggerStep *local_70;
  ulong local_68;
  Index *local_60;
  FKey *local_58;
  Token local_50;
  Token local_40;
  
  if (((pParse->db->flags & 0x40000) != 0) &&
     (pFKey = sqlite3FkReferences(pTab), pFKey != (FKey *)0x0)) {
    local_68 = (ulong)(pChanges != (ExprList *)0x0);
    do {
      uVar2 = pFKey->aAction[local_68];
      p = pFKey->apTrigger[local_68];
      if (p == (Trigger *)0x0 && uVar2 != '\0') {
        db = pParse->db;
        local_60 = (Index *)0x0;
        local_90 = (int *)0x0;
        iVar6 = sqlite3FkLocateIndex(pParse,pTab,pFKey,&local_60,&local_90);
        if (iVar6 == 0) {
          if (pFKey->nCol < 1) {
            local_e8 = (Expr *)0x0;
            local_c0 = (ExprList *)0x0;
            local_b8 = (Expr *)0x0;
          }
          else {
            psVar1 = pFKey->aCol;
            local_98 = (char *)CONCAT71(local_98._1_7_,
                                        (uVar2 != '\t' || pChanges != (ExprList *)0x0) &&
                                        uVar2 != '\x06');
            lVar14 = 0;
            local_b8 = (Expr *)0x0;
            local_c0 = (ExprList *)0x0;
            local_e8 = (Expr *)0x0;
            local_58 = pFKey;
            do {
              local_a8.z = "old";
              local_a8.n = 3;
              local_a8._12_4_ = 0;
              psVar7 = (sColMap *)(local_90 + lVar14);
              if (local_90 == (int *)0x0) {
                psVar7 = psVar1;
              }
              local_88.z = "new";
              local_88.n = 3;
              local_88._12_4_ = 0;
              local_50.z = "oid";
              if (local_60 != (Index *)0x0) {
                local_50.z = pTab->aCol[local_60->aiColumn[lVar14]].zName;
              }
              iVar6 = psVar7->iFrom;
              local_40.z = pFKey->pFrom->aCol[iVar6].zName;
              local_40.n = 0;
              local_50.n = 0;
              if (local_50.z != (char *)0x0) {
                local_50.n = 0xffffffff;
                pcVar10 = local_50.z;
                do {
                  local_50.n = local_50.n + 1;
                  cVar3 = *pcVar10;
                  pcVar10 = pcVar10 + 1;
                } while (cVar3 != '\0');
                local_50.n = local_50.n & 0x3fffffff;
              }
              if (local_40.z != (char *)0x0) {
                local_40.n = 0xffffffff;
                pcVar10 = local_40.z;
                do {
                  local_40.n = local_40.n + 1;
                  cVar3 = *pcVar10;
                  pcVar10 = pcVar10 + 1;
                } while (cVar3 != '\0');
                local_40.n = local_40.n & 0x3fffffff;
              }
              pEVar8 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_a8);
              pEVar9 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_50);
              pEVar8 = sqlite3PExpr(pParse,0x76,pEVar8,pEVar9,(Token *)0x0);
              pEVar9 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_40);
              pEVar8 = sqlite3PExpr(pParse,0x4c,pEVar8,pEVar9,(Token *)0x0);
              local_e8 = sqlite3ExprAnd(db,local_e8,pEVar8);
              if (pChanges != (ExprList *)0x0) {
                pEVar8 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_a8);
                pEVar9 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_50);
                pEVar8 = sqlite3PExpr(pParse,0x76,pEVar8,pEVar9,(Token *)0x0);
                pEVar9 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_88);
                pRight = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_50);
                pEVar9 = sqlite3PExpr(pParse,0x76,pEVar9,pRight,(Token *)0x0);
                pEVar8 = sqlite3PExpr(pParse,0x46,pEVar8,pEVar9,(Token *)0x0);
                local_b8 = sqlite3ExprAnd(db,local_b8,pEVar8);
              }
              pFKey = local_58;
              if ((char)local_98 != '\0') {
                if (uVar2 == '\b') {
                  pEVar8 = local_58->pFrom->aCol[iVar6].pDflt;
                  if (pEVar8 == (Expr *)0x0) goto LAB_0016e613;
                  pEVar8 = exprDup(db,pEVar8,0,(u8 **)0x0);
                }
                else {
                  if (uVar2 == '\t') {
                    pEVar8 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_88);
                    pEVar9 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_50);
                    iVar6 = 0x76;
                  }
                  else {
LAB_0016e613:
                    iVar6 = 0x62;
                    pEVar8 = (Expr *)0x0;
                    pEVar9 = (Expr *)0x0;
                  }
                  pEVar8 = sqlite3PExpr(pParse,iVar6,pEVar8,pEVar9,(Token *)0x0);
                }
                local_c0 = sqlite3ExprListAppend((Parse *)pParse->db,local_c0,pEVar8);
                sqlite3ExprListSetName(pParse,local_c0,&local_40,0);
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < pFKey->nCol);
          }
          sqlite3DbFree(db,local_90);
          local_98 = pFKey->pFrom->zName;
          if (local_98 == (char *)0x0) {
            uVar13 = 0;
          }
          else {
            uVar13 = 0xffffffff;
            pcVar10 = local_98;
            do {
              uVar13 = uVar13 + 1;
              cVar3 = *pcVar10;
              pcVar10 = pcVar10 + 1;
            } while (cVar3 != '\0');
            uVar13 = uVar13 & 0x3fffffff;
          }
          if (uVar2 == '\x06') {
            local_88.n = uVar13;
            local_a8.z = "foreign key constraint failed";
            local_a8.n = 0x1d;
            local_88.z = local_98;
            pEVar8 = sqlite3ExprAlloc(db,0x38,&local_a8,0);
            if (pEVar8 == (Expr *)0x0) {
              pParse_00 = pParse->db;
              pEVar8 = (Expr *)0x0;
            }
            else {
              pEVar8->affinity = '\x02';
              pParse_00 = pParse->db;
            }
            pEList = sqlite3ExprListAppend((Parse *)pParse_00,(ExprList *)0x0,pEVar8);
            pSrc = sqlite3SrcListAppend(db,(SrcList *)0x0,&local_88,(Token *)0x0);
            local_c8 = sqlite3SelectNew(pParse,pEList,pSrc,local_e8,(ExprList *)0x0,(Expr *)0x0,
                                        (ExprList *)0x0,0,(Expr *)0x0,(Expr *)0x0);
            local_e8 = (Expr *)0x0;
          }
          else {
            local_c8 = (Select *)0x0;
          }
          uVar4 = (db->lookaside).bEnabled;
          (db->lookaside).bEnabled = '\0';
          p = (Trigger *)sqlite3DbMallocRaw(db,uVar13 + 0x99);
          if (p == (Trigger *)0x0) {
            local_70 = (TriggerStep *)0x0;
          }
          else {
            memset(p,0,(ulong)(uVar13 + 0x99));
            local_70 = (TriggerStep *)(p + 1);
            p->step_list = local_70;
            p[1].pWhen = (Expr *)&p[2].table;
            *(uint *)&p[1].pColumns = uVar13;
            memcpy(&p[2].table,local_98,(ulong)uVar13);
            pSVar11 = (Schema *)exprDup(db,local_e8,1,(u8 **)0x0);
            p[1].pSchema = pSVar11;
            pSVar11 = (Schema *)sqlite3ExprListDup(db,local_c0,1);
            p[1].pTabSchema = pSVar11;
            pSVar12 = sqlite3SelectDup(db,local_c8,1);
            *(Select **)&p[1].op = pSVar12;
            if (local_b8 == (Expr *)0x0) {
              local_b8 = (Expr *)0x0;
            }
            else {
              local_b8 = sqlite3PExpr(pParse,0x13,local_b8,(Expr *)0x0,(Token *)0x0);
              pEVar8 = exprDup(db,local_b8,1,(u8 **)0x0);
              p->pWhen = pEVar8;
            }
          }
          (db->lookaside).bEnabled = uVar4;
          sqlite3ExprDelete(db,local_e8);
          sqlite3ExprDelete(db,local_b8);
          sqlite3ExprListDelete(db,local_c0);
          sqlite3SelectDelete(db,local_c8);
          if (db->mallocFailed != '\x01') {
            if (uVar2 == '\x06') {
              uVar5 = 0x74;
            }
            else if ((uVar2 == '\t') && (pChanges == (ExprList *)0x0)) {
              uVar5 = 0x6a;
            }
            else {
              uVar5 = 0x6b;
            }
            local_70->op = uVar5;
            local_70->pTrig = p;
            pSVar11 = pTab->pSchema;
            p->pSchema = pSVar11;
            p->pTabSchema = pSVar11;
            pFKey->apTrigger[local_68] = p;
            p->op = pChanges != (ExprList *)0x0 | 0x6a;
            goto LAB_0016e940;
          }
          fkTriggerDelete(db,p);
        }
      }
      else if (p != (Trigger *)0x0) {
LAB_0016e940:
        sqlite3CodeRowTriggerDirect(pParse,p,pTab,regOld,2,0);
      }
      pFKey = pFKey->pNextTo;
    } while (pFKey != (FKey *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld                      /* Address of array containing old row */
){
  /* If foreign-key support is enabled, iterate through all FKs that 
  ** refer to table pTab. If there is an action associated with the FK 
  ** for this operation (either update or delete), invoke the associated 
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      Trigger *pAction = fkActionTrigger(pParse, pTab, pFKey, pChanges);
      if( pAction ){
        sqlite3CodeRowTriggerDirect(pParse, pAction, pTab, regOld, OE_Abort, 0);
      }
    }
  }
}